

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall
capnp::LocalClient::LocalClient(LocalClient *this,Own<capnp::Capability::Server> *serverParam)

{
  Server *pSVar1;
  
  ClientHook::ClientHook(&this->super_ClientHook);
  (this->super_Refcounted).refcount = 0;
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR_newCall_003a13d0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_003a1428;
  pSVar1 = serverParam->ptr;
  (this->server).disposer = serverParam->disposer;
  (this->server).ptr = pSVar1;
  serverParam->ptr = (Server *)0x0;
  this->capServerSet = (CapabilityServerSetBase *)0x0;
  this->ptr = (void *)0x0;
  ((this->server).ptr)->thisHook = &this->super_ClientHook;
  return;
}

Assistant:

LocalClient(kj::Own<Capability::Server>&& serverParam)
      : server(kj::mv(serverParam)) {
    server->thisHook = this;
  }